

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__psd_info(stbi__context *s,int *x,int *y,int *comp)

{
  stbi__uint32 sVar1;
  int iVar2;
  int iVar3;
  undefined4 *in_RCX;
  stbi__uint32 *in_RDX;
  stbi__uint32 *in_RSI;
  stbi__context *in_RDI;
  int channelCount;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 local_4;
  
  sVar1 = stbi__get32be((stbi__context *)
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (sVar1 == 0x38425053) {
    iVar2 = stbi__get16be((stbi__context *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if (iVar2 == 1) {
      stbi__skip((stbi__context *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffcc);
      iVar2 = stbi__get16be((stbi__context *)
                            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      if ((iVar2 < 0) || (0x10 < iVar2)) {
        stbi__rewind(in_RDI);
        local_4 = 0;
      }
      else {
        sVar1 = stbi__get32be((stbi__context *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
        *in_RDX = sVar1;
        sVar1 = stbi__get32be((stbi__context *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
        *in_RSI = sVar1;
        iVar3 = stbi__get16be((stbi__context *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
        if (iVar3 == 8) {
          iVar2 = stbi__get16be((stbi__context *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
          if (iVar2 == 3) {
            *in_RCX = 4;
            local_4 = 1;
          }
          else {
            stbi__rewind(in_RDI);
            local_4 = 0;
          }
        }
        else {
          stbi__rewind(in_RDI);
          local_4 = 0;
        }
      }
    }
    else {
      stbi__rewind(in_RDI);
      local_4 = 0;
    }
  }
  else {
    stbi__rewind(in_RDI);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int stbi__psd_info(stbi__context *s, int *x, int *y, int *comp)
{
   int channelCount;
   if (stbi__get32be(s) != 0x38425053) {
       stbi__rewind( s );
       return 0;
   }
   if (stbi__get16be(s) != 1) {
       stbi__rewind( s );
       return 0;
   }
   stbi__skip(s, 6);
   channelCount = stbi__get16be(s);
   if (channelCount < 0 || channelCount > 16) {
       stbi__rewind( s );
       return 0;
   }
   *y = stbi__get32be(s);
   *x = stbi__get32be(s);
   if (stbi__get16be(s) != 8) {
       stbi__rewind( s );
       return 0;
   }
   if (stbi__get16be(s) != 3) {
       stbi__rewind( s );
       return 0;
   }
   *comp = 4;
   return 1;
}